

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  IfcTypeObject *this_00;
  long *plVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcTypeProduct).super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeObject *)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 + lVar2);
  plVar1 = (long *)(&this->field_0x168 + lVar2);
  plVar1[-0x2d] = 0x8d1c28;
  plVar1[3] = 0x8d1cf0;
  plVar1[-0x1c] = 0x8d1c50;
  plVar1[-0x1a] = 0x8d1c78;
  plVar1[-0xf] = 0x8d1ca0;
  plVar1[-4] = 0x8d1cc8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  *(undefined8 *)this_00 = 0x8d1e08;
  *(undefined8 *)&this_00[1].field_0x78 = 0x8d1ea8;
  *(undefined8 *)&this_00->field_0x88 = 0x8d1e30;
  (this_00->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x8d1e58;
  *(undefined8 *)&this_00->field_0xf0 = 0x8d1e80;
  if (*(undefined1 **)&this_00[1].field_0x18 != &this_00[1].field_0x28) {
    operator_delete(*(undefined1 **)&this_00[1].field_0x18,*(long *)&this_00[1].field_0x28 + 1);
  }
  pvVar3 = *(void **)&this_00->field_0x100;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this_00[1].field_0x8 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject(this_00,&PTR_construction_vtable_24__008d1d10);
  operator_delete(this_00,0x198);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}